

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcf_strtrimr(mpc_val_t *x)

{
  size_t sVar1;
  ushort **ppuVar2;
  
  sVar1 = strlen((char *)x);
  if (sVar1 != 0) {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)*(byte *)((long)x + (sVar1 - 1)) * 2 + 1) & 0x20) == 0)
      {
        return x;
      }
      *(undefined1 *)((long)x + (sVar1 - 1)) = 0;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  return x;
}

Assistant:

mpc_val_t *mpcf_strtrimr(mpc_val_t *x) {
  char *s = x;
  size_t l = strlen(s);
  while (l > 0 && isspace((unsigned char)s[l-1])) {
    s[l-1] = '\0'; l--;
  }
  return s;
}